

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.h
# Opt level: O1

void cppcms::impl::details::decimal_traits<true>::conv<int>(int v,char **begin,char **buf)

{
  char *pcVar1;
  uint uVar2;
  
  pcVar1 = *buf;
  if (v < 0) {
    *buf = pcVar1 + 1;
    *pcVar1 = '-';
    *begin = *buf;
    do {
      pcVar1 = *buf;
      *buf = pcVar1 + 1;
      *pcVar1 = '0' - ((char)v + (char)(v / 10) * -10);
      uVar2 = v + 9;
      v = v / 10;
    } while (0x12 < uVar2);
  }
  else {
    *begin = pcVar1;
    if (v != 0) {
      do {
        pcVar1 = *buf;
        *buf = pcVar1 + 1;
        *pcVar1 = (char)v + (char)(v / 10) * -10 + '0';
        uVar2 = v + 9;
        v = v / 10;
      } while (0x12 < uVar2);
    }
  }
  return;
}

Assistant:

static void conv(T v,char *&begin,char *&buf)
				{
					if(v<0) {
						*buf++ = '-';
						begin=buf;
						while(v!=0) {
							*buf++ = '0' - (v % 10);
							v/=10;
						}
					}
					else {
						decimal_traits<false>::conv(v,begin,buf);
					}
				}